

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_ifindex(char *str)

{
  int iVar1;
  long lVar2;
  char *in_RDI;
  int ret;
  char *endp;
  if_nameindex *cached;
  if_nameindex *lp;
  char *local_28;
  if_nameindex *local_20;
  if_nameindex *str_00;
  int local_4;
  
  local_20 = saved;
  lVar2 = strtol(in_RDI,&local_28,0);
  local_4 = (int)lVar2;
  if (*local_28 != '\0') {
    fetch_names();
    for (str_00 = saved; str_00->if_index != 0; str_00 = str_00 + 1) {
      iVar1 = strcmp(str_00->if_name,in_RDI);
      if (iVar1 == 0) {
        return str_00->if_index;
      }
    }
    if (local_20 == (if_nameindex *)0x0) {
      local_4 = 0;
    }
    else {
      libj1939_cleanup();
      local_4 = libj1939_ifindex((char *)str_00);
    }
  }
  return local_4;
}

Assistant:

static int libj1939_ifindex(const char *str)
{
	const struct if_nameindex *lp, *cached = saved;
	char *endp;
	int ret;

	ret = strtol(str, &endp, 0);
	if (!*endp)
		/* did some good parse */
		return ret;

	fetch_names();
	for (lp = saved; lp->if_index; ++lp) {
		if (!strcmp(lp->if_name, str))
			return lp->if_index;
	}
	if (cached) {
		libj1939_cleanup();
		return libj1939_ifindex(str);
	}
	return 0;
}